

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::TryGetValueAndRemove
          (SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  bool bVar1;
  type tVar2;
  uint local_34;
  int local_30;
  uint targetBucket;
  int last;
  int i;
  TBValue *value_local;
  TBKey *key_local;
  SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *this_local;
  
  _last = value;
  value_local = (TBValue *)key;
  key_local = (TBKey *)this;
  bVar1 = SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
          ::FindEntryWithKey<Js::RecyclableObject*>
                    ((SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
                      *)this,key,(int *)&targetBucket,&local_30,&local_34);
  if (bVar1) {
    tVar2 = GetValue<true>(this,targetBucket);
    *_last = tVar2;
    RemoveAt(this,targetBucket,local_30,local_34);
  }
  return bVar1;
}

Assistant:

bool TryGetValueAndRemove(const TBKey& key, TBValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = this->GetValue(i);
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }